

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

void REVcreate_terminal_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CMFormat format;
  FMStructDescList format_list;
  EVSimpleHandlerFunc handler;
  EV_int_response response;
  undefined4 local_30;
  EVstone local_2c;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  format_list = REVPlookup_format_structs(conn->cm,*(char **)((long)data + 8));
  handler = REVPlookup_handler(*(char **)((long)data + 0x10));
  local_2c = EVcreate_terminal_action(cm,format_list,handler,(void *)0x0);
  local_30 = *data;
  CMwrite(conn,format,&local_30);
  return;
}

Assistant:

static void
REVcreate_terminal_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVcreate_terminal_action_request *request = (EVcreate_terminal_action_request *) data;
    EVstone ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    FMStructDescList format_list = REVPlookup_format_structs(conn->cm, request->format_list);
    EVSimpleHandlerFunc handler = REVPlookup_handler(request->handler);
    ret = EVcreate_terminal_action(cm, format_list, handler, NULL);
    response.ret = (int)ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}